

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O3

Polynomial<int32_t,_double> * anon_unknown.dwarf_c7dac::GeneratePolynomialINT(void)

{
  void *pvVar1;
  Polynomial<int32_t,_double> *extraout_RAX;
  Polynomial<int32_t,_double> *extraout_RAX_00;
  Polynomial<int32_t,_double> *extraout_RAX_01;
  Polynomial<int32_t,_double> *extraout_RAX_02;
  Polynomial<int32_t,_double> *extraout_RAX_03;
  Polynomial<int32_t,_double> *extraout_RAX_04;
  Polynomial<int32_t,_double> *extraout_RAX_05;
  Polynomial<int32_t,_double> *extraout_RAX_06;
  Polynomial<int32_t,_double> *extraout_RAX_07;
  Polynomial<int32_t,_double> *extraout_RAX_08;
  Polynomial<int32_t,_double> *extraout_RAX_09;
  Polynomial<int32_t,_double> *extraout_RAX_10;
  Polynomial<int32_t,_double> *extraout_RAX_11;
  Polynomial<int32_t,_double> *extraout_RAX_12;
  Polynomial<int32_t,_double> *extraout_RAX_13;
  Polynomial<int32_t,_double> *extraout_RAX_14;
  Polynomial<int32_t,_double> *extraout_RAX_15;
  Polynomial<int32_t,_double> *pPVar2;
  long lVar3;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  initializer_list<int> __l_02;
  initializer_list<int> __l_03;
  initializer_list<int> __l_04;
  initializer_list<int> __l_05;
  initializer_list<int> __l_06;
  initializer_list<int> __l_07;
  initializer_list<int> __l_08;
  initializer_list<int> __l_09;
  initializer_list<int> __l_10;
  initializer_list<int> __l_11;
  initializer_list<int> __l_12;
  initializer_list<int> __l_13;
  allocator_type local_40f;
  allocator_type local_40e;
  allocator_type local_40d;
  allocator_type local_40c;
  allocator_type local_40b;
  allocator_type local_40a;
  allocator_type local_409;
  allocator_type local_408;
  allocator_type local_407;
  allocator_type local_406;
  allocator_type local_405;
  allocator_type local_404;
  allocator_type local_403;
  allocator_type local_402;
  allocator_type local_401;
  vector<int,_std::allocator<int>_> local_400;
  vector<int,_std::allocator<int>_> local_3e8;
  vector<int,_std::allocator<int>_> local_3d0;
  vector<int,_std::allocator<int>_> local_3b8;
  vector<int,_std::allocator<int>_> local_3a0;
  vector<int,_std::allocator<int>_> local_388;
  vector<int,_std::allocator<int>_> local_370;
  vector<int,_std::allocator<int>_> local_358;
  vector<int,_std::allocator<int>_> local_340;
  vector<int,_std::allocator<int>_> local_328;
  vector<int,_std::allocator<int>_> local_310;
  vector<int,_std::allocator<int>_> local_2f8;
  vector<int,_std::allocator<int>_> local_2e0;
  vector<int,_std::allocator<int>_> local_2c8;
  int local_2b0 [4];
  vector<int,_std::allocator<int>_> local_2a0;
  int local_288 [22];
  undefined8 uStack_230;
  int local_228 [2];
  long alStack_220 [2];
  vector<int,_std::allocator<int>_> local_210;
  undefined8 local_1f8;
  vector<int,_std::allocator<int>_> local_1f0;
  undefined8 local_1d8;
  vector<int,_std::allocator<int>_> local_1d0;
  undefined1 *local_1b8;
  vector<int,_std::allocator<int>_> local_1b0;
  undefined8 local_198;
  vector<int,_std::allocator<int>_> local_190;
  undefined8 local_178;
  vector<int,_std::allocator<int>_> local_170;
  undefined8 local_158;
  vector<int,_std::allocator<int>_> local_150;
  undefined8 local_138;
  vector<int,_std::allocator<int>_> local_130;
  undefined8 local_118;
  vector<int,_std::allocator<int>_> local_110;
  undefined8 local_f8;
  vector<int,_std::allocator<int>_> local_f0;
  undefined8 local_d8;
  vector<int,_std::allocator<int>_> local_d0;
  undefined8 local_b8;
  vector<int,_std::allocator<int>_> local_b0;
  undefined8 local_98;
  vector<int,_std::allocator<int>_> local_90;
  undefined8 local_78;
  vector<int,_std::allocator<int>_> local_70;
  undefined8 local_58;
  vector<int,_std::allocator<int>_> local_50;
  undefined8 local_38;
  
  local_2b0[3] = 0xffffffff;
  __l._M_len = 1;
  __l._M_array = local_2b0 + 3;
  std::vector<int,_std::allocator<int>_>::vector(&local_2a0,__l,&local_401);
  std::vector<int,_std::allocator<int>_>::vector(&local_210,&local_2a0);
  local_1f8 = 0x3ff0000000000000;
  local_2b0[2] = 0xfffffffe;
  __l_00._M_len = 1;
  __l_00._M_array = local_2b0 + 2;
  std::vector<int,_std::allocator<int>_>::vector(&local_2c8,__l_00,&local_402);
  std::vector<int,_std::allocator<int>_>::vector(&local_1f0,&local_2c8);
  local_1d8 = 0x4000000000000000;
  local_2b0[1] = 0xfffffffd;
  __l_01._M_len = 1;
  __l_01._M_array = local_2b0 + 1;
  std::vector<int,_std::allocator<int>_>::vector(&local_2e0,__l_01,&local_403);
  std::vector<int,_std::allocator<int>_>::vector(&local_1d0,&local_2e0);
  local_1b8 = &DAT_4008000000000000;
  local_2b0[0] = -4;
  __l_02._M_len = 1;
  __l_02._M_array = local_2b0;
  std::vector<int,_std::allocator<int>_>::vector(&local_2f8,__l_02,&local_404);
  std::vector<int,_std::allocator<int>_>::vector(&local_1b0,&local_2f8);
  local_198 = 0x4010000000000000;
  local_288[10] = -1;
  local_288[0xb] = -2;
  __l_03._M_len = 2;
  __l_03._M_array = local_288 + 10;
  std::vector<int,_std::allocator<int>_>::vector(&local_310,__l_03,&local_405);
  std::vector<int,_std::allocator<int>_>::vector(&local_190,&local_310);
  local_178 = 0x4028000000000000;
  local_288[8] = -1;
  local_288[9] = -3;
  __l_04._M_len = 2;
  __l_04._M_array = local_288 + 8;
  std::vector<int,_std::allocator<int>_>::vector(&local_328,__l_04,&local_406);
  std::vector<int,_std::allocator<int>_>::vector(&local_170,&local_328);
  local_158 = 0x402a000000000000;
  local_288[6] = -1;
  local_288[7] = -4;
  __l_05._M_len = 2;
  __l_05._M_array = local_288 + 6;
  std::vector<int,_std::allocator<int>_>::vector(&local_340,__l_05,&local_407);
  std::vector<int,_std::allocator<int>_>::vector(&local_150,&local_340);
  local_138 = 0x402c000000000000;
  local_288[4] = -2;
  local_288[5] = -3;
  __l_06._M_len = 2;
  __l_06._M_array = local_288 + 4;
  std::vector<int,_std::allocator<int>_>::vector(&local_358,__l_06,&local_408);
  std::vector<int,_std::allocator<int>_>::vector(&local_130,&local_358);
  local_118 = 0x4037000000000000;
  local_288[2] = -2;
  local_288[3] = -4;
  __l_07._M_len = 2;
  __l_07._M_array = local_288 + 2;
  std::vector<int,_std::allocator<int>_>::vector(&local_370,__l_07,&local_409);
  std::vector<int,_std::allocator<int>_>::vector(&local_110,&local_370);
  local_f8 = 0x4038000000000000;
  local_288[0] = -3;
  local_288[1] = -4;
  __l_08._M_len = 2;
  __l_08._M_array = local_288;
  std::vector<int,_std::allocator<int>_>::vector(&local_388,__l_08,&local_40a);
  std::vector<int,_std::allocator<int>_>::vector(&local_f0,&local_388);
  local_d8 = 0x4041000000000000;
  stack0xfffffffffffffdcc = 0xfffffffeffffffff;
  uStack_230._4_4_ = 0xfffffffd;
  __l_09._M_len = 3;
  __l_09._M_array = local_288 + 0x15;
  std::vector<int,_std::allocator<int>_>::vector(&local_3a0,__l_09,&local_40b);
  std::vector<int,_std::allocator<int>_>::vector(&local_d0,&local_3a0);
  local_b8 = 0x405ec00000000000;
  local_288[0x12] = -1;
  local_288[0x13] = -2;
  local_288[0x14] = 0xfffffffc;
  __l_10._M_len = 3;
  __l_10._M_array = local_288 + 0x12;
  std::vector<int,_std::allocator<int>_>::vector(&local_3b8,__l_10,&local_40c);
  std::vector<int,_std::allocator<int>_>::vector(&local_b0,&local_3b8);
  local_98 = 0x405f000000000000;
  local_288[0xf] = -1;
  local_288[0x10] = -3;
  local_288[0x11] = 0xfffffffc;
  __l_11._M_len = 3;
  __l_11._M_array = local_288 + 0xf;
  std::vector<int,_std::allocator<int>_>::vector(&local_3d0,__l_11,&local_40d);
  std::vector<int,_std::allocator<int>_>::vector(&local_90,&local_3d0);
  local_78 = 0x4060c00000000000;
  local_288[0xc] = -2;
  local_288[0xd] = -3;
  local_288[0xe] = 0xfffffffc;
  __l_12._M_len = 3;
  __l_12._M_array = local_288 + 0xc;
  std::vector<int,_std::allocator<int>_>::vector(&local_3e8,__l_12,&local_40e);
  std::vector<int,_std::allocator<int>_>::vector(&local_70,&local_3e8);
  local_58 = 0x406d400000000000;
  local_228[0] = -1;
  local_228[1] = -2;
  alStack_220[0] = -0x300000003;
  __l_13._M_len = 4;
  __l_13._M_array = local_228;
  std::vector<int,_std::allocator<int>_>::vector(&local_400,__l_13,&local_40f);
  std::vector<int,_std::allocator<int>_>::vector(&local_50,&local_400);
  local_38 = 0x4093480000000000;
  std::
  _Hashtable<std::vector<int,std::allocator<int>>,std::pair<std::vector<int,std::allocator<int>>const,double>,std::allocator<std::pair<std::vector<int,std::allocator<int>>const,double>>,std::__detail::_Select1st,std::equal_to<std::vector<int,std::allocator<int>>>,cimod::vector_hash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_Hashtable<std::pair<std::vector<int,std::allocator<int>>const,double>const*>();
  lVar3 = 0x1e0;
  pPVar2 = extraout_RAX;
  do {
    pvVar1 = *(void **)((long)local_228 + lVar3 + -8);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,*(long *)((long)alStack_220 + lVar3) - (long)pvVar1);
      pPVar2 = extraout_RAX_00;
    }
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != 0);
  if (local_400.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_400.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_400.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_400.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
    pPVar2 = extraout_RAX_01;
  }
  if (local_3e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_3e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_3e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_3e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
    pPVar2 = extraout_RAX_02;
  }
  if (local_3d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_3d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_3d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_3d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
    pPVar2 = extraout_RAX_03;
  }
  if (local_3b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_3b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_3b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_3b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
    pPVar2 = extraout_RAX_04;
  }
  if (local_3a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_3a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_3a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_3a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
    pPVar2 = extraout_RAX_05;
  }
  if (local_388.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_388.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_388.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_388.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
    pPVar2 = extraout_RAX_06;
  }
  if (local_370.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_370.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_370.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_370.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
    pPVar2 = extraout_RAX_07;
  }
  if (local_358.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_358.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_358.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_358.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
    pPVar2 = extraout_RAX_08;
  }
  if (local_340.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_340.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_340.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_340.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
    pPVar2 = extraout_RAX_09;
  }
  if (local_328.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_328.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_328.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_328.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
    pPVar2 = extraout_RAX_10;
  }
  if (local_310.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_310.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_310.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_310.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
    pPVar2 = extraout_RAX_11;
  }
  if (local_2f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_2f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
    pPVar2 = extraout_RAX_12;
  }
  if (local_2e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_2e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
    pPVar2 = extraout_RAX_13;
  }
  if (local_2c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_2c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
    pPVar2 = extraout_RAX_14;
  }
  if (local_2a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_2a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
    pPVar2 = extraout_RAX_15;
  }
  return pPVar2;
}

Assistant:

Polynomial<int32_t, double> GeneratePolynomialINT() {
   
   Polynomial<int32_t, double> polynomial {
      //linear biases
      {{-1}, 1.0}, {{-2}, 2.0}, {{-3}, 3.0}, {{-4}, 4.0},
      //quadratic biases
      {{-1, -2}, 12.0}, {{-1, -3}, 13.0}, {{-1, -4}, 14.0},
      {{-2, -3}, 23.0}, {{-2, -4}, 24.0},
      {{-3, -4}, 34.0},
      //polynomial biases
      {{-1, -2, -3}, 123.0}, {{-1, -2, -4}, 124.0}, {{-1, -3, -4}, 134.0},
      {{-2, -3, -4}, 234.0},
      {{-1, -2, -3, -4}, 1234.0}
   };
   
   return polynomial;
}